

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_filter.cc
# Opt level: O2

void __thiscall sptk::reaper::FdFilter::MakeLinearFir(FdFilter *this,float fc,int *nf,float *coef)

{
  int iVar1;
  uint uVar2;
  float *pfVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  double dVar7;
  
  uVar2 = *nf;
  if ((uVar2 & 0x80000001) != 1) {
    uVar2 = uVar2 + 1;
    *nf = uVar2;
  }
  uVar2 = (int)(uVar2 + 1) / 2;
  *coef = fc + fc;
  for (lVar5 = 1; lVar5 < (int)uVar2; lVar5 = lVar5 + 1) {
    dVar7 = sin((double)fc * 6.283185307179586 * (double)(int)lVar5);
    coef[lVar5] = (float)(dVar7 / ((double)(int)lVar5 * 3.141592653589793));
  }
  iVar1 = *nf;
  uVar4 = 0;
  uVar6 = 0;
  if (0 < (int)uVar2) {
    uVar6 = (ulong)uVar2;
  }
  pfVar3 = coef + (int)uVar2;
  for (; pfVar3 = pfVar3 + -1, uVar6 != uVar4; uVar4 = uVar4 + 1) {
    dVar7 = cos(((double)(int)uVar4 + 0.5) * (6.283185307179586 / (double)iVar1));
    *pfVar3 = (float)((double)*pfVar3 * (dVar7 * -0.5 + 0.5));
  }
  return;
}

Assistant:

void FdFilter::MakeLinearFir(float fc, int *nf, float *coef) {
  int i, n;
  double twopi, fn, c;

  if (((*nf % 2) != 1))
    *nf = *nf + 1;
  n = (*nf + 1) / 2;

  /*  Compute part of the ideal impulse response (the sin(x)/x kernel). */
  twopi = M_PI * 2.0;
  coef[0] = 2.0 * fc;
  c = M_PI;
  fn = twopi * fc;
  for (i = 1; i < n; i++)
    coef[i] = sin(i * fn) / (c * i);

  /* Now apply a Hanning window to the (infinite) impulse response. */
  /* (Could use other windows, like Kaiser, Gaussian...) */
  fn = twopi / *nf;
  for (i = 0; i < n; i++)
    coef[n - i - 1] *= (.5 - (.5 * cos(fn * (i + 0.5))));
}